

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::scanTokens(yaml *this,StringRef Input)

{
  char cVar1;
  StringRef Input_00;
  undefined1 local_208 [8];
  Scanner scanner;
  SourceMgr SM;
  Token T;
  
  SM.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SM.DiagHandler = (DiagHandlerTy)0x0;
  SM.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  SM.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SM.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SM.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.EC = (error_code *)0x0;
  SM.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Input_00.Length = (size_t)Input.Data;
  Input_00.Data = (char *)this;
  Scanner::Scanner((Scanner *)local_208,Input_00,(SourceMgr *)&scanner.EC,true,(error_code *)0x0);
  do {
    Scanner::getNext((Token *)&SM.DiagContext,(Scanner *)local_208);
    cVar1 = (int)SM.DiagContext == 0;
    if ((int)SM.DiagContext == 2) {
      cVar1 = '\x03';
    }
    if ((size_type *)T.Range.Length != &T.Value._M_string_length) {
      operator_delete((void *)T.Range.Length,T.Value._M_string_length + 1);
    }
  } while (cVar1 == '\0');
  if ((uint *)scanner.Indents.super_SmallVectorStorage<int,_4U>.InlineElts._8_8_ !=
      &scanner.SimpleKeys.super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
       super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
       super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase
       .Size) {
    free((void *)scanner.Indents.super_SmallVectorStorage<int,_4U>.InlineElts._8_8_);
  }
  if (scanner.TokenQueue.List.Sentinel.
      super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
      .super_node_base_type.Next !=
      (ilist_node_base<false> *)
      &scanner.Indents.super_SmallVectorImpl<int>.super_SmallVectorTemplateBase<int,_true>.
       super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.Size) {
    free(scanner.TokenQueue.List.Sentinel.
         super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
         .super_node_base_type.Next);
  }
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::~AllocatorList((AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                    *)&scanner.IsStartOfStream);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&SM.Buffers.
                super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::~vector
            ((vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_> *)
             &scanner.EC);
  return cVar1 == '\x03';
}

Assistant:

bool yaml::scanTokens(StringRef Input) {
  SourceMgr SM;
  Scanner scanner(Input, SM);
  while (true) {
    Token T = scanner.getNext();
    if (T.Kind == Token::TK_StreamEnd)
      break;
    else if (T.Kind == Token::TK_Error)
      return false;
  }
  return true;
}